

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFOutlineDocumentHelper.cc
# Opt level: O2

void __thiscall QPDFOutlineDocumentHelper::initializeByPage(QPDFOutlineDocumentHelper *this)

{
  QPDFOutlineObjectHelper *this_00;
  element_type *peVar1;
  mapped_type *this_01;
  vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_> kids;
  list<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_> queue;
  QPDFOutlineObjectHelper oh;
  undefined1 local_a0 [32];
  undefined1 local_80 [80];
  
  local_80._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar1 = (this->m).
           super___shared_ptr<QPDFOutlineDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  local_80._0_8_ = (element_type *)local_80;
  local_80._8_8_ = (element_type *)local_80;
  std::__cxx11::list<QPDFOutlineObjectHelper,std::allocator<QPDFOutlineObjectHelper>>::
  insert<__gnu_cxx::__normal_iterator<QPDFOutlineObjectHelper*,std::vector<QPDFOutlineObjectHelper,std::allocator<QPDFOutlineObjectHelper>>>,void>
            ((list<QPDFOutlineObjectHelper,std::allocator<QPDFOutlineObjectHelper>> *)local_80,
             (const_iterator)local_80,
             (peVar1->outlines).
             super__Vector_base<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>.
             _M_impl.super__Vector_impl_data._M_start,
             (peVar1->outlines).
             super__Vector_base<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  this_00 = (QPDFOutlineObjectHelper *)(local_80 + 0x18);
  while ((element_type *)local_80._0_8_ != (element_type *)local_80) {
    QPDFOutlineObjectHelper::QPDFOutlineObjectHelper
              (this_00,(QPDFOutlineObjectHelper *)(local_80._0_8_ + 0x10));
    std::__cxx11::list<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>::pop_front
              ((list<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_> *)local_80);
    peVar1 = (this->m).
             super___shared_ptr<QPDFOutlineDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    QPDFOutlineObjectHelper::getDestPage((QPDFOutlineObjectHelper *)local_a0);
    local_a0._24_8_ = QPDFObjectHandle::getObjGen((QPDFObjectHandle *)local_a0);
    this_01 = std::
              map<QPDFObjGen,_std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>_>_>_>
              ::operator[](&peVar1->by_page,(key_type *)(local_a0 + 0x18));
    std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>::push_back
              (this_01,this_00);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a0 + 8));
    QPDFOutlineObjectHelper::getKids
              ((vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_> *)local_a0
               ,this_00);
    std::__cxx11::list<QPDFOutlineObjectHelper,std::allocator<QPDFOutlineObjectHelper>>::
    insert<__gnu_cxx::__normal_iterator<QPDFOutlineObjectHelper*,std::vector<QPDFOutlineObjectHelper,std::allocator<QPDFOutlineObjectHelper>>>,void>
              ((list<QPDFOutlineObjectHelper,std::allocator<QPDFOutlineObjectHelper>> *)local_80,
               (const_iterator)local_80,
               (__normal_iterator<QPDFOutlineObjectHelper_*,_std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>_>
                )local_a0._0_8_,
               (__normal_iterator<QPDFOutlineObjectHelper_*,_std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>_>
                )local_a0._8_8_);
    std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>::~vector
              ((vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_> *)local_a0
              );
    QPDFOutlineObjectHelper::~QPDFOutlineObjectHelper(this_00);
  }
  std::__cxx11::_List_base<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>::
  _M_clear((_List_base<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_> *)local_80
          );
  return;
}

Assistant:

void
QPDFOutlineDocumentHelper::initializeByPage()
{
    std::list<QPDFOutlineObjectHelper> queue;
    queue.insert(queue.end(), m->outlines.begin(), m->outlines.end());

    while (!queue.empty()) {
        QPDFOutlineObjectHelper oh = queue.front();
        queue.pop_front();
        m->by_page[oh.getDestPage().getObjGen()].push_back(oh);
        std::vector<QPDFOutlineObjectHelper> kids = oh.getKids();
        queue.insert(queue.end(), kids.begin(), kids.end());
    }
}